

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlCatalogEntryPtr
xmlParseXMLCatalogOneNode
          (xmlNodePtr cur,xmlCatalogEntryType type,xmlChar *name,xmlChar *attrName,
          xmlChar *uriAttrName,xmlCatalogPrefer prefer,xmlCatalogEntryPtr cgroup)

{
  xmlGenericErrorFunc p_Var1;
  bool bVar2;
  xmlChar *name_00;
  xmlChar *URI;
  xmlChar *base;
  xmlChar *URL;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  xmlCatalogEntryPtr pxVar5;
  
  if (attrName == (xmlChar *)0x0) {
    bVar2 = false;
    name_00 = (xmlChar *)0x0;
  }
  else {
    name_00 = xmlGetProp(cur,attrName);
    if (name_00 == (xmlChar *)0x0) {
      name_00 = (xmlChar *)0x0;
      xmlCatalogErr((xmlCatalogEntryPtr)0x0,cur,0x672,"%s entry lacks \'%s\'\n",name,attrName,
                    (xmlChar *)0x0);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  URI = xmlGetProp(cur,uriAttrName);
  if (URI == (xmlChar *)0x0) {
    xmlCatalogErr((xmlCatalogEntryPtr)0x0,cur,0x672,"%s entry lacks \'%s\'\n",name,uriAttrName,
                  (xmlChar *)0x0);
  }
  else if (!bVar2) {
    base = xmlNodeGetBase(cur->doc,cur);
    URL = xmlBuildURI(URI,base);
    if (URL == (xmlChar *)0x0) {
      pxVar5 = (xmlCatalogEntryPtr)0x0;
      xmlCatalogErr((xmlCatalogEntryPtr)0x0,cur,0x673,"%s entry \'%s\' broken ?: %s\n",name,
                    uriAttrName,URI);
    }
    else {
      if (1 < xmlDebugCatalogs) {
        pp_Var3 = __xmlGenericError();
        p_Var1 = *pp_Var3;
        ppvVar4 = __xmlGenericErrorContext();
        if (name_00 == (xmlChar *)0x0) {
          (*p_Var1)(*ppvVar4,"Found %s: \'%s\'\n",name,URL);
        }
        else {
          (*p_Var1)(*ppvVar4,"Found %s: \'%s\' \'%s\'\n",name,name_00,URL);
        }
      }
      pxVar5 = xmlNewCatalogEntry(type,name_00,URI,URL,prefer,cgroup);
    }
    if (name_00 != (xmlChar *)0x0) {
      (*xmlFree)(name_00);
    }
    (*xmlFree)(URI);
    if (base != (xmlChar *)0x0) {
      (*xmlFree)(base);
    }
    goto joined_r0x0013d0a4;
  }
  if (name_00 != (xmlChar *)0x0) {
    (*xmlFree)(name_00);
  }
  pxVar5 = (xmlCatalogEntryPtr)0x0;
  URL = URI;
joined_r0x0013d0a4:
  if (URL != (xmlChar *)0x0) {
    (*xmlFree)(URL);
  }
  return pxVar5;
}

Assistant:

static xmlCatalogEntryPtr
xmlParseXMLCatalogOneNode(xmlNodePtr cur, xmlCatalogEntryType type,
			  const xmlChar *name, const xmlChar *attrName,
			  const xmlChar *uriAttrName, xmlCatalogPrefer prefer,
			  xmlCatalogEntryPtr cgroup) {
    int ok = 1;
    xmlChar *uriValue;
    xmlChar *nameValue = NULL;
    xmlChar *base = NULL;
    xmlChar *URL = NULL;
    xmlCatalogEntryPtr ret = NULL;

    if (attrName != NULL) {
	nameValue = xmlGetProp(cur, attrName);
	if (nameValue == NULL) {
	    xmlCatalogErr(ret, cur, XML_CATALOG_MISSING_ATTR,
			  "%s entry lacks '%s'\n", name, attrName, NULL);
	    ok = 0;
	}
    }
    uriValue = xmlGetProp(cur, uriAttrName);
    if (uriValue == NULL) {
	xmlCatalogErr(ret, cur, XML_CATALOG_MISSING_ATTR,
		"%s entry lacks '%s'\n", name, uriAttrName, NULL);
	ok = 0;
    }
    if (!ok) {
	if (nameValue != NULL)
	    xmlFree(nameValue);
	if (uriValue != NULL)
	    xmlFree(uriValue);
	return(NULL);
    }

    base = xmlNodeGetBase(cur->doc, cur);
    URL = xmlBuildURI(uriValue, base);
    if (URL != NULL) {
	if (xmlDebugCatalogs > 1) {
	    if (nameValue != NULL)
		xmlGenericError(xmlGenericErrorContext,
			"Found %s: '%s' '%s'\n", name, nameValue, URL);
	    else
		xmlGenericError(xmlGenericErrorContext,
			"Found %s: '%s'\n", name, URL);
	}
	ret = xmlNewCatalogEntry(type, nameValue, uriValue, URL, prefer, cgroup);
    } else {
	xmlCatalogErr(ret, cur, XML_CATALOG_ENTRY_BROKEN,
		"%s entry '%s' broken ?: %s\n", name, uriAttrName, uriValue);
    }
    if (nameValue != NULL)
	xmlFree(nameValue);
    if (uriValue != NULL)
	xmlFree(uriValue);
    if (base != NULL)
	xmlFree(base);
    if (URL != NULL)
	xmlFree(URL);
    return(ret);
}